

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_read.c
# Opt level: O0

size_t mpt_message_read(mpt_message *msg,size_t len,void *dest)

{
  void *__n;
  bool bVar1;
  size_t part;
  size_t total;
  void *dest_local;
  size_t len_local;
  mpt_message *msg_local;
  
  part = 0;
  total = (size_t)dest;
  dest_local = (void *)len;
  while( true ) {
    __n = (void *)msg->used;
    if (dest_local <= __n) {
      if (dest_local != (void *)0x0) {
        if (total != 0) {
          memcpy((void *)total,msg->base,(size_t)dest_local);
        }
        msg->base = (void *)((long)msg->base + (long)dest_local);
        msg->used = msg->used - (long)dest_local;
      }
      while( true ) {
        bVar1 = false;
        if (msg->used == 0) {
          bVar1 = msg->clen != 0;
        }
        if (!bVar1) break;
        msg->used = msg->cont->iov_len;
        msg->base = msg->cont->iov_base;
        msg->cont = msg->cont + 1;
        msg->clen = msg->clen - 1;
      }
      return part + (long)dest_local;
    }
    if (__n != (void *)0x0) {
      if (total != 0) {
        memcpy((void *)total,msg->base,(size_t)__n);
        total = total + (long)__n;
      }
      part = (long)__n + part;
      dest_local = (void *)((long)dest_local - (long)__n);
    }
    if (msg->clen == 0) break;
    msg->used = msg->cont->iov_len;
    msg->base = msg->cont->iov_base;
    msg->cont = msg->cont + 1;
    msg->clen = msg->clen - 1;
  }
  msg->base = (void *)((long)msg->base + (long)__n);
  msg->used = msg->used - (long)__n;
  return part;
}

Assistant:

extern size_t mpt_message_read(MPT_STRUCT(message) *msg, size_t len, void *dest)
{
	size_t total = 0, part;
	
	while (len > (part = msg->used)) {
		if (part) {
			if (dest) {
				memcpy(dest, msg->base, part);
				dest = ((uint8_t *) dest) + part;
			}
			total += part;
			len   -= part;
		}
		if (!msg->clen) {
			msg->base = ((uint8_t *) msg->base) + part;
			msg->used -= part;
			return total;
		}
		msg->used = msg->cont->iov_len;
		msg->base = msg->cont->iov_base;
		++msg->cont;
		--msg->clen;
	}
	if (len) {
		if (dest) memcpy(dest, msg->base, len);
		msg->base = ((uint8_t *) msg->base) + len;
		msg->used -= len;
	}
	while (!msg->used && msg->clen) {
		msg->used = msg->cont->iov_len;
		msg->base = msg->cont->iov_base;
		++msg->cont;
		--msg->clen;
	}
	
	return total + len;
}